

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFboCompletenessTests.cpp
# Opt level: O2

void deqp::gls::fboc::details::logAffectingExtensions
               (char *prefix,FormatDB *db,ImageFormat *format,FormatFlags feature,
               MessageBuilder *msg)

{
  ImageFormat format_00;
  _Rb_tree_node_base *p_Var1;
  _Base_ptr p_Var2;
  undefined4 in_register_0000000c;
  ostream *poVar3;
  _Self __tmp;
  char *pcVar4;
  _Self __tmp_1;
  string extName;
  string local_80;
  set<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  rows;
  
  format_00.format = *(GLenum *)&(db->m_formatFlags)._M_t._M_impl.field_0x0;
  format_00.unsizedType = *(GLenum *)&(db->m_formatFlags)._M_t._M_impl.field_0x4;
  FboUtil::FormatDB::getFormatFeatureExtensions_abi_cxx11_
            (&rows,(FormatDB *)prefix,format_00,(FormatFlags)format);
  poVar3 = (ostream *)(CONCAT44(in_register_0000000c,feature) + 8);
  for (p_Var2 = rows._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &rows._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    p_Var1 = p_Var2[1]._M_right;
    extName._M_dataplus._M_p = (pointer)&extName.field_2;
    extName._M_string_length = 0;
    extName.field_2._M_local_buf[0] = '\0';
    std::operator<<(poVar3,"\t\t- ");
    p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1);
    std::__cxx11::string::_M_assign((string *)&extName);
    while (p_Var1 != (_Rb_tree_node_base *)&p_Var2[1]._M_parent) {
      FboUtil::getExtensionDescription(&local_80,&extName);
      std::operator<<(poVar3,(string *)&local_80);
      std::__cxx11::string::~string((string *)&local_80);
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1);
      std::__cxx11::string::_M_assign((string *)&extName);
      pcVar4 = " and ";
      if (p_Var1 != (_Rb_tree_node_base *)&p_Var2[1]._M_parent) {
        pcVar4 = ", ";
      }
      std::operator<<(poVar3,pcVar4);
    }
    FboUtil::getExtensionDescription(&local_80,&extName);
    std::operator<<(poVar3,(string *)&local_80);
    std::operator<<(poVar3,'\n');
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&extName);
  }
  std::
  _Rb_tree<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Identity<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~_Rb_tree(&rows._M_t);
  return;
}

Assistant:

static void logAffectingExtensions (const char* prefix, const FormatDB& db, const ImageFormat& format, FormatFlags feature, tcu::MessageBuilder& msg)
{
	const std::set<std::set<std::string> > rows = db.getFormatFeatureExtensions(format, feature);

	for (std::set<std::set<std::string> >::const_iterator rowIt = rows.begin(); rowIt != rows.end(); ++rowIt)
	{
		const std::set<std::string>&			requiredExtensions	= *rowIt;
		std::set<std::string>::const_iterator	it					= requiredExtensions.begin();
		std::string								extName;

		msg << prefix;

		extName = *it++;
		while (it != requiredExtensions.end())
		{
			msg << getExtensionDescription(extName);
			extName = *it++;
			msg << (it == requiredExtensions.end() ? " and " : ", ");
		}

		msg << getExtensionDescription(extName) << '\n';
	}
}